

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_SDL_Surface_*>::Matcher
          (Matcher<const_SDL_Surface_*> *this,SDL_Surface *value)

{
  ComparisonBase<testing::internal::EqMatcher<const_SDL_Surface_*>,_const_SDL_Surface_*,_testing::internal::AnyEq>
  local_38;
  Matcher<const_SDL_Surface_*> local_30;
  SDL_Surface *local_18;
  SDL_Surface *value_local;
  Matcher<const_SDL_Surface_*> *this_local;
  
  local_18 = value;
  value_local = (SDL_Surface *)this;
  internal::MatcherBase<const_SDL_Surface_*>::MatcherBase
            (&this->super_MatcherBase<const_SDL_Surface_*>);
  (this->super_MatcherBase<const_SDL_Surface_*>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_00508478;
  local_38.rhs_ = (SDL_Surface *)Eq<SDL_Surface_const*>(local_18);
  Matcher<SDL_Surface_const*>::Matcher<testing::internal::EqMatcher<SDL_Surface_const*>,void>
            ((Matcher<SDL_Surface_const*> *)&local_30,(EqMatcher<const_SDL_Surface_*> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }